

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall
FMultiBlockLinesIterator::startIteratorForGroup(FMultiBlockLinesIterator *this,int group)

{
  double dVar1;
  subsector_t *psVar2;
  sector_t_conflict *psVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = 0.0;
  dVar5 = 0.0;
  if (this->basegroup != group) {
    dVar4 = Displacements.data.Array[Displacements.size * group + (int)this->basegroup].pos.X;
    dVar5 = Displacements.data.Array[Displacements.size * group + (int)this->basegroup].pos.Y;
  }
  dVar4 = (this->checkpoint).X + dVar4;
  dVar5 = (this->checkpoint).Y + dVar5;
  (this->offset).X = dVar4;
  (this->offset).Y = dVar5;
  psVar3 = (sector_t_conflict *)this->startsector;
  if (psVar3->PortalGroup != group) {
    psVar2 = P_PointInSubsector(dVar4,dVar5);
    psVar3 = psVar2->sector;
    dVar4 = (this->offset).X;
    dVar5 = (this->offset).Y;
  }
  this->cursector = (sector_t *)psVar3;
  dVar1 = (this->checkpoint).Z;
  (this->bbox).m_Box[0] = dVar5 + dVar1;
  (this->bbox).m_Box[3] = dVar4 + dVar1;
  (this->bbox).m_Box[1] = dVar5 - dVar1;
  (this->bbox).m_Box[2] = dVar4 - dVar1;
  FBlockLinesIterator::init(&this->blockIterator,(EVP_PKEY_CTX *)&this->bbox);
  return;
}

Assistant:

void FMultiBlockLinesIterator::startIteratorForGroup(int group)
{
	offset = Displacements.getOffset(basegroup, group);
	offset.X += checkpoint.X;
	offset.Y += checkpoint.Y;
	cursector = group == startsector->PortalGroup ? startsector : P_PointInSector(offset);
	bbox.setBox(offset.X, offset.Y, checkpoint.Z);
	blockIterator.init(bbox);
}